

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

double fcss_seas(double *b,int pq,void *params)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  void *__dest;
  void *__dest_00;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  double dVar18;
  double dVar19;
  
  uVar14 = *params;
  lVar16 = (long)(int)uVar14;
  iVar15 = *(int *)((long)params + 0xc);
  lVar9 = (long)iVar15;
  uVar1 = *(uint *)((long)params + 8);
  uVar11 = *(uint *)((long)params + 0x10);
  iVar6 = uVar11 * iVar15;
  uVar7 = iVar6 + uVar14;
  uVar2 = *(uint *)((long)params + 0x18);
  uVar17 = uVar2 * iVar15 + uVar1;
  uVar3 = *(uint *)((long)params + 0x28);
  iVar4 = *(int *)((long)params + 0x50);
  __dest = malloc((long)(int)uVar7 << 3);
  __dest_00 = malloc((long)(int)uVar17 << 3);
  if (0 < lVar16) {
    memcpy(__dest,b,(ulong)uVar14 * 8);
  }
  if (0 < iVar6) {
    uVar5 = uVar14 + 1;
    if ((int)(uVar14 + 1) < (int)uVar7) {
      uVar5 = uVar7;
    }
    memset((void *)((long)__dest + lVar16 * 8),0,(ulong)(~uVar14 + uVar5) * 8 + 8);
  }
  if (0 < (int)uVar1) {
    memcpy(__dest_00,b + lVar16,(ulong)uVar1 * 8);
  }
  if (0 < (int)(uVar2 * iVar15)) {
    uVar5 = uVar1 + 1;
    if ((int)(uVar1 + 1) < (int)uVar17) {
      uVar5 = uVar17;
    }
    memset((void *)((long)__dest_00 + (long)(int)uVar1 * 8),0,(ulong)(~uVar1 + uVar5) * 8 + 8);
  }
  if (0 < (int)uVar11) {
    pvVar8 = (void *)((long)__dest + lVar9 * 8);
    uVar10 = 0;
    do {
      dVar18 = b[(long)(int)(uVar1 + uVar14) + uVar10];
      uVar10 = uVar10 + 1;
      *(double *)((long)__dest + uVar10 * lVar9 * 8 + -8) =
           *(double *)((long)__dest + uVar10 * lVar9 * 8 + -8) + dVar18;
      if (0 < (int)uVar14) {
        uVar12 = 0;
        do {
          *(double *)((long)pvVar8 + uVar12 * 8) =
               *(double *)((long)pvVar8 + uVar12 * 8) - b[uVar12] * dVar18;
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
      }
      pvVar8 = (void *)((long)pvVar8 + lVar9 * 8);
    } while (uVar10 != uVar11);
  }
  if (0 < (int)uVar2) {
    pvVar8 = (void *)((long)__dest_00 + lVar9 * 8);
    uVar10 = 0;
    do {
      dVar18 = b[(long)(int)(uVar1 + uVar14 + uVar11) + uVar10];
      uVar10 = uVar10 + 1;
      *(double *)((long)__dest_00 + uVar10 * lVar9 * 8 + -8) =
           *(double *)((long)__dest_00 + uVar10 * lVar9 * 8 + -8) + dVar18;
      if (0 < (int)uVar1) {
        uVar12 = 0;
        do {
          *(double *)((long)pvVar8 + uVar12 * 8) =
               b[lVar16 + uVar12] * dVar18 + *(double *)((long)pvVar8 + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar1 != uVar12);
      }
      pvVar8 = (void *)((long)pvVar8 + lVar9 * 8);
    } while (uVar10 != uVar2);
  }
  if (0 < (int)uVar7) {
    uVar10 = 0;
    do {
      *(undefined8 *)((long)params + uVar10 * 8 + (long)(int)(iVar4 + uVar3) * 8 + 0x58) = 0;
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  if (0 < (int)uVar3 && *(int *)((long)params + 0x2c) == 1) {
    uVar10 = 0;
    do {
      *(double *)((long)params + uVar10 * 8 + (long)iVar4 * 8 + 0x58) =
           *(double *)((long)params + uVar10 * 8 + (long)(int)(iVar4 + uVar3 * 2) * 8 + 0x58) -
           b[(int)(uVar11 + uVar2 + uVar1 + uVar14)];
      uVar10 = uVar10 + 1;
    } while (uVar3 != uVar10);
  }
  dVar19 = 0.0;
  dVar18 = 0.0;
  if ((int)uVar7 < (int)uVar3) {
    lVar16 = lVar16 + iVar6;
    lVar9 = ((ulong)(uVar14 + iVar4 + iVar6) << 0x20) + -0x100000000;
    iVar15 = iVar6 + uVar3 + iVar4 + uVar14 + -1;
    uVar14 = 0;
    do {
      uVar1 = uVar17;
      if ((int)uVar14 < (int)uVar17) {
        uVar1 = uVar14;
      }
      dVar19 = *(double *)((long)params + (lVar16 + iVar4) * 8 + 0x58);
      if (0 < (int)uVar7) {
        uVar10 = 0;
        lVar13 = lVar9;
        do {
          dVar19 = dVar19 - *(double *)((long)__dest + uVar10 * 8) *
                            *(double *)((long)params + (lVar13 >> 0x1d) + 0x58);
          uVar10 = uVar10 + 1;
          lVar13 = lVar13 + -0x100000000;
        } while (uVar7 != uVar10);
      }
      uVar11 = (int)lVar16 - uVar7;
      if ((int)uVar17 <= (int)uVar11) {
        uVar11 = uVar17;
      }
      if (0 < (int)uVar11) {
        uVar10 = 0;
        iVar6 = iVar15;
        do {
          dVar19 = dVar19 - *(double *)((long)__dest_00 + uVar10 * 8) *
                            *(double *)((long)params + (long)iVar6 * 8 + 0x58);
          uVar10 = uVar10 + 1;
          iVar6 = iVar6 + -1;
        } while (uVar1 != uVar10);
      }
      uVar14 = uVar14 + 1;
      *(double *)((long)params + (lVar16 + (int)(iVar4 + uVar3)) * 8 + 0x58) = dVar19;
      dVar18 = dVar18 + dVar19 * dVar19;
      lVar16 = lVar16 + 1;
      lVar9 = lVar9 + 0x100000000;
      iVar15 = iVar15 + 1;
    } while (lVar16 < (int)uVar3);
    dVar19 = (double)(int)uVar14;
  }
  *(double *)((long)params + 0x40) = dVar18;
  dVar18 = log(dVar18 / dVar19);
  *(double *)((long)params + 0x48) = dVar18 * 0.5;
  free(__dest);
  free(__dest_00);
  return dVar18 * 0.5;
}

Assistant:

double fcss_seas(double *b, int pq, void *params) {
	double value, ssq,temp;
	int p, q, ps, qs, s, offset,jm;
	int ip, iq, i, j, N,iter,ncond;
	double *phi, *theta;

	value = ssq =  0.0;
	
	alik_css_seas_object obj = (alik_css_seas_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);

	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	offset = obj->offset;
	ncond = p + s* ps;

	//printf("\n %d %d %d \n", s,ps, qs);

	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);



	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	//mdisplay(theta, 1, q + s*qs);
	//mdisplay(b, 1, p + q + ps + qs);
	for (i = 0; i < ncond; ++i) {
		obj->x[offset+N + i] = 0.0;
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset+i] = obj->x[offset+ 2 * N + i] - b[p+q+ps+qs];
		}
	}
	iter = 0;
	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[offset+i];

		for (j = 0; j < ip; ++j) {
			temp = temp - phi[j] * obj->x[offset + i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[offset+N + i - j - 1];
		}

		obj->x[offset+N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	//printf("ssq %g %g \n", value,ssq);

	free(phi);
	free(theta);
	return value;
}